

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

void __thiscall
duckdb::Vector::FindResizeInfos
          (Vector *this,vector<duckdb::ResizeInfo,_true> *resize_infos,idx_t multiplier)

{
  pointer *ppRVar1;
  VectorBufferType VVar2;
  iterator __position;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *puVar3;
  VectorBuffer *pVVar4;
  type this_00;
  pointer this_01;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child;
  buffer_ptr<VectorBuffer> *this_02;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_03;
  ResizeInfo resize_info;
  shared_ptr<duckdb::VectorBuffer,_true> local_58;
  ResizeInfo local_48;
  
  local_48.data = this->data;
  local_48.buffer.ptr =
       (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  __position._M_current =
       (resize_infos->super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>).
       super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.vec = this;
  local_48.multiplier = multiplier;
  if (__position._M_current ==
      (resize_infos->super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>).
      super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<duckdb::ResizeInfo,std::allocator<duckdb::ResizeInfo>>::
    _M_realloc_insert<duckdb::ResizeInfo&>
              ((vector<duckdb::ResizeInfo,std::allocator<duckdb::ResizeInfo>> *)resize_infos,
               __position,&local_48);
  }
  else {
    ((__position._M_current)->buffer).ptr = local_48.buffer.ptr;
    (__position._M_current)->multiplier = multiplier;
    (__position._M_current)->vec = this;
    (__position._M_current)->data = local_48.data;
    ppRVar1 = &(resize_infos->super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>)
               .super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppRVar1 = *ppRVar1 + 1;
  }
  if (this->data == (data_ptr_t)0x0) {
    local_58.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->auxiliary).internal.
         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->auxiliary).internal.
         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_58.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_58.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_58.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    pVVar4 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&local_58);
    VVar2 = pVVar4->buffer_type;
    if (local_58.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    this_02 = &this->auxiliary;
    if (VVar2 == STRUCT_BUFFER) {
      pVVar4 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_02);
      puVar3 = *(unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> **)
                &pVVar4[1].buffer_type;
      for (this_03 = (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                     pVVar4[1]._vptr_VectorBuffer; this_03 != puVar3; this_03 = this_03 + 1) {
        this_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (this_03);
        FindResizeInfos(this_01,resize_infos,multiplier);
      }
    }
    else {
      if (VVar2 == LIST_BUFFER) {
        pVVar4 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_02);
      }
      else {
        if (VVar2 != ARRAY_BUFFER) {
          return;
        }
        pVVar4 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_02);
        multiplier = multiplier * *(long *)&pVVar4[1].buffer_type;
      }
      this_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                           (pVVar4 + 1));
      FindResizeInfos(this_00,resize_infos,multiplier);
    }
  }
  return;
}

Assistant:

void Vector::FindResizeInfos(vector<ResizeInfo> &resize_infos, const idx_t multiplier) {

	ResizeInfo resize_info(*this, data, buffer.get(), multiplier);
	resize_infos.emplace_back(resize_info);

	// Base case.
	if (data) {
		return;
	}

	D_ASSERT(auxiliary);
	switch (GetAuxiliary()->GetBufferType()) {
	case VectorBufferType::LIST_BUFFER: {
		auto &vector_list_buffer = auxiliary->Cast<VectorListBuffer>();
		auto &child = vector_list_buffer.GetChild();
		child.FindResizeInfos(resize_infos, multiplier);
		break;
	}
	case VectorBufferType::STRUCT_BUFFER: {
		auto &vector_struct_buffer = auxiliary->Cast<VectorStructBuffer>();
		auto &children = vector_struct_buffer.GetChildren();
		for (auto &child : children) {
			child->FindResizeInfos(resize_infos, multiplier);
		}
		break;
	}
	case VectorBufferType::ARRAY_BUFFER: {
		// We need to multiply the multiplier by the array size because
		// the child vectors of ARRAY types are always child_count * array_size.
		auto &vector_array_buffer = auxiliary->Cast<VectorArrayBuffer>();
		auto new_multiplier = vector_array_buffer.GetArraySize() * multiplier;
		auto &child = vector_array_buffer.GetChild();
		child.FindResizeInfos(resize_infos, new_multiplier);
		break;
	}
	default:
		break;
	}
}